

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

void artifact_exists(obj *otmp,char *name,boolean mod)

{
  artifact *paVar1;
  short sVar2;
  int iVar3;
  short sVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  
  paVar1 = artilist;
  if (((otmp != (obj *)0x0) && (*name != '\0')) && (sVar2 = artilist[1].otyp, sVar2 != 0)) {
    sVar4 = otmp->otyp;
    uVar7 = 0x40;
    lVar5 = 0x100000000;
    do {
      if ((sVar2 == sVar4) &&
         (iVar3 = strcmp(*(char **)((long)&paVar1->name + uVar7),name), iVar3 == 0)) {
        if (mod != '\0') {
          strip_oprops(otmp);
          sVar4 = otmp->otyp;
        }
        cVar6 = (char)(uVar7 >> 6);
        if (mod == '\0') {
          cVar6 = '\0';
        }
        otmp->oartifact = cVar6;
        otmp->age = 0;
        if (sVar4 == 0xa4) {
          otmp->spe = '\0';
        }
        artiexist[lVar5 >> 0x20] = mod;
        return;
      }
      sVar2 = *(short *)((long)&paVar1[1].otyp + uVar7);
      uVar7 = uVar7 + 0x40;
      lVar5 = lVar5 + 0x100000000;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

void artifact_exists(struct obj *otmp, const char *name, boolean mod)
{
	const struct artifact *a;

	if (otmp && *name)
	    for (a = artilist+1; a->otyp; a++)
		if (a->otyp == otmp->otyp && !strcmp(a->name, name)) {
		    int m = a - artilist;
		    if (mod) /* artifacts can't have properties */
			strip_oprops(otmp);
		    otmp->oartifact = (char)(mod ? m : 0);
		    otmp->age = 0;
		    if (otmp->otyp == RIN_INCREASE_DAMAGE)
			otmp->spe = 0;
		    artiexist[m] = mod;
		    break;
		}
	return;
}